

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AStateProvider_A_FireProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *pAVar2;
  DObject *this;
  void *pvVar3;
  AWeapon *this_00;
  DAngle type;
  uint uVar4;
  VMValue *pVVar5;
  bool bVar6;
  double speed;
  bool local_119;
  bool local_116;
  bool local_113;
  TAngle<double> local_110;
  TFlags<ActorFlag2,_unsigned_int> local_104;
  TAngle<double> local_100;
  AActor *local_f8;
  AActor *misl;
  TAngle<double> local_e8;
  DAngle saved_player_pitch;
  TAngle<double> local_d8;
  DAngle shootangle;
  DVector2 ofs;
  DAngle ang;
  FTranslatedLineTarget t;
  AWeapon *weapon;
  player_t *player;
  DAngle pitch;
  double dStack_78;
  int flags;
  double spawnheight;
  double spawnofs_xy;
  bool useammo;
  DAngle angle;
  MetaClass *ti;
  FStateParamInfo *stateinfo;
  AStateProvider *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  local_113 = true;
  if (pAVar2 != (AActor *)0x0) {
    local_113 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
  }
  if (local_113 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar6 = true, param[1].field_0.field_1.atag != 1)) {
    bVar6 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar6) {
    this = (DObject *)param[1].field_0.field_1.a;
    local_116 = true;
    if (this != (DObject *)0x0) {
      local_116 = DObject::IsKindOf(this,AStateProvider::RegistrationInfo.MyClass);
    }
    if (local_116 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7c9,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7c9,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type == '\x03') {
      pvVar3 = param[2].field_0.field_1.a;
      if (numparam < 4) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x7ca,
                      "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      bVar6 = false;
      if ((param[3].field_0.field_3.Type == '\x03') &&
         (bVar6 = true, param[3].field_0.field_1.atag != 1)) {
        bVar6 = param[3].field_0.field_1.a == (void *)0x0;
      }
      if (bVar6) {
        angle.Degrees = *(double *)&param[3].field_0;
        local_119 = true;
        if ((PClass *)angle.Degrees != (PClass *)0x0) {
          local_119 = PClass::IsDescendantOf
                                ((PClass *)angle.Degrees,AActor::RegistrationInfo.MyClass);
        }
        if (local_119 != false) {
          TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa0);
          if (numparam < 5) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
            if ((pVVar5->field_0).field_3.Type != '\x01') {
              __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7cb,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
            TAngle<double>::operator=
                      ((TAngle<double> *)&stack0xffffffffffffffa0,(pVVar5->field_0).f);
          }
          else {
            if (param[4].field_0.field_3.Type != '\x01') {
              __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7cb,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffa0,param[4].field_0.f)
            ;
          }
          if (numparam < 6) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
            if ((pVVar5->field_0).field_3.Type != '\0') {
              __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7cc,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
            iVar1 = (pVVar5->field_0).i;
          }
          else {
            if (param[5].field_0.field_3.Type != '\0') {
              __assert_fail("(param[paramnum]).Type == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7cc,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar1 = param[5].field_0.i;
          }
          if (numparam < 7) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
            if ((pVVar5->field_0).field_3.Type != '\x01') {
              __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7cd,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
            spawnheight = (pVVar5->field_0).f;
          }
          else {
            if (param[6].field_0.field_3.Type != '\x01') {
              __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7cd,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            spawnheight = param[6].field_0.f;
          }
          if (numparam < 8) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
            if ((pVVar5->field_0).field_3.Type != '\x01') {
              __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7ce,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
            dStack_78 = (pVVar5->field_0).f;
          }
          else {
            if (param[7].field_0.field_3.Type != '\x01') {
              __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x7ce,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            dStack_78 = param[7].field_0.f;
          }
          if (numparam < 9) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
            if ((pVVar5->field_0).field_3.Type != '\0') {
              __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,1999,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
            pitch.Degrees._4_4_ = (pVVar5->field_0).i;
          }
          else {
            if (param[8].field_0.field_3.Type != '\0') {
              __assert_fail("(param[paramnum]).Type == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,1999,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pitch.Degrees._4_4_ = param[8].field_0.i;
          }
          TAngle<double>::TAngle((TAngle<double> *)&player);
          if (numparam < 10) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
            if ((pVVar5->field_0).field_3.Type != '\x01') {
              __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,2000,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
            TAngle<double>::operator=((TAngle<double> *)&player,(pVVar5->field_0).f);
          }
          else {
            if (param[9].field_0.field_3.Type != '\x01') {
              __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,2000,
                            "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            TAngle<double>::operator=((TAngle<double> *)&player,param[9].field_0.f);
          }
          if (pAVar2->player != (player_t *)0x0) {
            this_00 = pAVar2->player->ReadyWeapon;
            FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&ang);
            if ((((((iVar1 == 0) || (pAVar2->player == (player_t *)0x0)) || (pvVar3 == (void *)0x0))
                 || ((*(int *)((long)pvVar3 + 8) != 1 || (this_00 == (AWeapon *)0x0)))) ||
                (bVar6 = AWeapon::DepleteAmmo(this_00,(bool)(this_00->bAltFire & 1),true,-1), bVar6)
                ) && (angle.Degrees != 0.0)) {
              TAngle<double>::operator-((TAngle<double> *)&ofs.Y,90.0);
              TAngle<double>::ToVector(&shootangle,spawnheight);
              TAngle<double>::TAngle(&local_d8,&(pAVar2->Angles).Yaw);
              if ((pitch.Degrees._4_4_ & 1) != 0) {
                TAngle<double>::TAngle
                          (&saved_player_pitch,(TAngle<double> *)&stack0xffffffffffffffa0);
                TAngle<double>::operator+=(&local_d8,&saved_player_pitch);
              }
              TAngle<double>::TAngle(&local_e8,&(pAVar2->Angles).Pitch);
              TAngle<double>::TAngle((TAngle<double> *)&misl,(TAngle<double> *)&player);
              TAngle<double>::operator-=(&(pAVar2->Angles).Pitch,(TAngle<double> *)&misl);
              type = angle;
              TAngle<double>::TAngle(&local_100,&local_d8);
              local_f8 = P_SpawnPlayerMissile
                                   (pAVar2,shootangle.Degrees,ofs.X,dStack_78,
                                    (PClassActor *)type.Degrees,&local_100,
                                    (FTranslatedLineTarget *)&ang,(AActor **)0x0,false,
                                    (pitch.Degrees._4_4_ & 4) != 0,0);
              TAngle<double>::operator=(&(pAVar2->Angles).Pitch,&local_e8);
              if (local_f8 != (AActor *)0x0) {
                if ((pitch.Degrees._4_4_ & 2) != 0) {
                  local_f8->Translation = pAVar2->Translation;
                }
                bVar6 = false;
                if ((ang.Degrees != 0.0) &&
                   (bVar6 = false, (t.attackAngleFromSource.Degrees._0_1_ & 1) == 0)) {
                  TFlags<ActorFlag2,_unsigned_int>::operator&
                            (&local_104,(int)local_f8 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
                  bVar6 = uVar4 != 0;
                }
                if (bVar6) {
                  TObjPtr<AActor>::operator=(&local_f8->tracer,(AActor *)ang.Degrees);
                }
                if ((pitch.Degrees._4_4_ & 1) == 0) {
                  TAngle<double>::TAngle(&local_110,(TAngle<double> *)&stack0xffffffffffffffa0);
                  TAngle<double>::operator+=(&(local_f8->Angles).Yaw,&local_110);
                  pAVar2 = local_f8;
                  speed = AActor::VelXYToSpeed(local_f8);
                  AActor::VelFromAngle(pAVar2,speed);
                }
              }
            }
          }
          return 0;
        }
        __assert_fail("ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x7ca,
                      "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7ca,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x7c9,
                "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireProjectile)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_CLASS		(ti, AActor);
	PARAM_ANGLE_DEF	(angle);
	PARAM_BOOL_DEF	(useammo);
	PARAM_FLOAT_DEF	(spawnofs_xy);
	PARAM_FLOAT_DEF	(spawnheight);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(pitch);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;
	FTranslatedLineTarget t;

		// Only use ammo if called from a weapon
	if (useammo && ACTION_CALL_FROM_PSPRITE() && weapon)
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (ti) 
	{
		DAngle ang = self->Angles.Yaw - 90;
		DVector2 ofs = ang.ToVector(spawnofs_xy);
		DAngle shootangle = self->Angles.Yaw;

		if (flags & FPF_AIMATANGLE) shootangle += angle;

		// Temporarily adjusts the pitch
		DAngle saved_player_pitch = self->Angles.Pitch;
		self->Angles.Pitch -= pitch;
		AActor * misl=P_SpawnPlayerMissile (self, ofs.X, ofs.Y, spawnheight, ti, shootangle, &t, NULL, false, (flags & FPF_NOAUTOAIM) != 0);
		self->Angles.Pitch = saved_player_pitch;

		// automatic handling of seeker missiles
		if (misl)
		{
			if (flags & FPF_TRANSFERTRANSLATION)
				misl->Translation = self->Translation;
			if (t.linetarget && !t.unlinked && (misl->flags2 & MF2_SEEKERMISSILE))
				misl->tracer = t.linetarget;
			if (!(flags & FPF_AIMATANGLE))
			{
				// This original implementation is to aim straight ahead and then offset
				// the angle from the resulting direction. 
				misl->Angles.Yaw += angle;
				misl->VelFromAngle(misl->VelXYToSpeed());
			}
		}
	}
	return 0;
}